

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

bool __thiscall CmdLineArgsParser::ParseBoolean(CmdLineArgsParser *this)

{
  char16 cVar1;
  Exception *pEVar2;
  CmdLineArgsParser *this_local;
  
  cVar1 = CurChar(this);
  if (cVar1 == L':') {
    pEVar2 = (Exception *)__cxa_allocate_exception(8);
    Exception::Exception(pEVar2,L"\':\' not expected with a boolean flag");
    __cxa_throw(pEVar2,&Exception::typeinfo,0);
  }
  cVar1 = CurChar(this);
  if (cVar1 != L'-') {
    cVar1 = CurChar(this);
    if (cVar1 != L' ') {
      cVar1 = CurChar(this);
      if (cVar1 != L'\0') {
        pEVar2 = (Exception *)__cxa_allocate_exception(8);
        Exception::Exception(pEVar2,L"Invalid character after boolean flag");
        __cxa_throw(pEVar2,&Exception::typeinfo,0);
      }
    }
  }
  cVar1 = CurChar(this);
  return cVar1 != L'-';
}

Assistant:

bool
CmdLineArgsParser::ParseBoolean()
{
    if (CurChar() == ':')
    {
        throw Exception(_u("':' not expected with a boolean flag"));
    }
    else if (CurChar() != '-' && CurChar() != ' ' && CurChar() != 0)
    {
        throw Exception(_u("Invalid character after boolean flag"));
    }
    else
    {
        return (CurChar() != '-');
    }
}